

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O3

int net_tcp4_bind(int s,uchar *ip,unsigned_short port)

{
  int iVar1;
  sockaddr local_10;
  
  local_10.sa_data[6] = '\0';
  local_10.sa_data[7] = '\0';
  local_10.sa_data[8] = '\0';
  local_10.sa_data[9] = '\0';
  local_10.sa_data[10] = '\0';
  local_10.sa_data[0xb] = '\0';
  local_10.sa_data[0xc] = '\0';
  local_10.sa_data[0xd] = '\0';
  local_10.sa_family = 2;
  local_10.sa_data[0] = (char)(port >> 8);
  local_10.sa_data[1] = (char)port;
  local_10.sa_data._2_4_ = *(undefined4 *)ip;
  iVar1 = bind(s,&local_10,0x10);
  return iVar1;
}

Assistant:

int net_tcp4_bind(int s, unsigned char ip[4], unsigned short port) {
  struct sockaddr_in sa;

  memset(&sa, 0, sizeof(sa));

  sa.sin_family = AF_INET;

  unsigned char *ptr = (unsigned char *)&sa.sin_port;
  UINT16_PACK(ptr, port);
  memcpy(&sa.sin_addr, ip, 4);
  
  return bind(s, (struct sockaddr *)&sa, sizeof(sa));
}